

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

void __thiscall just::file::impl::input_file::input_file(input_file *this,string *filename_)

{
  FILE *pFVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)this,(string *)filename_);
  pFVar1 = fopen((filename_->_M_dataplus)._M_p,"rb");
  this->_f = (FILE *)pFVar1;
  if (pFVar1 == (FILE *)0x0) {
    std::operator+(&local_50,"Error opening ",filename_);
    std::operator+(&local_30,&local_50," for reading");
    throw_errno(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

explicit input_file(const std::string& filename_) :
          _filename(filename_),
          _f(std::fopen(filename_.c_str(), "rb"))
        {
          if (!_f)
          {
            throw_errno("Error opening " + filename_ + " for reading");
          }
        }